

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::FGetsFunc::checkArguments
          (FGetsFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5)

{
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Type *context_00;
  reference ppEVar2;
  SystemSubroutine *in_RCX;
  Args *in_RDX;
  undefined8 in_RSI;
  undefined1 isMethod;
  ASTContext *in_RDI;
  SourceLocation in_R8;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  Type *ft;
  Compilation *comp;
  Type *pTVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  DiagCode code;
  ASTContext *context_01;
  SourceLocation in_stack_fffffffffffffff8;
  
  isMethod = (undefined1)((ulong)in_RSI >> 0x38);
  context_01 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0xb213ff);
  pTVar3 = (Type *)0x2;
  callRange.endLoc = in_stack_fffffffffffffff8;
  callRange.startLoc = in_R8;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RCX,context_01,(bool)isMethod,in_RDX,callRange,in_stack_00000010,
                     in_stack_00000018);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    context_00 = not_null<const_slang::ast::Type_*>::operator*
                           ((not_null<const_slang::ast::Type_*> *)0xb21484);
    bVar1 = Type::canBeStringLike(pTVar3);
    if (bVar1) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1);
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xb21522)
      ;
      bVar1 = Type::isIntegral(pTVar3);
      if (bVar1) {
        pTVar3 = Compilation::getIntegerType(this_00);
      }
      else {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1)
        ;
        pTVar3 = SystemSubroutine::badArg
                           (in_RCX,(ASTContext *)context_00,
                            (Expression *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      }
    }
    else {
      code.subsystem = SysFuncs;
      code.code = 0x1b;
      ppEVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                          (in_RDX,0);
      ASTContext::addDiag(in_RDI,code,(*ppEVar2)->sourceRange);
      ast::operator<<((Diagnostic *)this_00,(Type *)in_R8);
      pTVar3 = Compilation::getErrorType(this_00);
    }
  }
  else {
    pTVar3 = Compilation::getErrorType(this_00);
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, 2))
            return comp.getErrorType();

        const Type& ft = *args[0]->type;
        if (!ft.canBeStringLike()) {
            context.addDiag(diag::InvalidStringArg, args[0]->sourceRange) << ft;
            return comp.getErrorType();
        }

        if (!args[1]->type->isIntegral())
            return badArg(context, *args[1]);

        return comp.getIntegerType();
    }